

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_linked_definitions_section.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::
linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
::key(linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
      *this,string *k)

{
  int iVar1;
  error_code eVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    eVar2 = rule::push<pstore::exchange::import_ns::string_rule,std::__cxx11::string*>
                      (&this->super_rule,&this->compilation_);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 != 0) {
    eVar2 = make_error_code(unrecognized_section_object_key);
    return eVar2;
  }
  *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
       (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
  eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                    (&this->super_rule,&this->index_);
  return eVar2;
}

Assistant:

std::error_code linked_definition<OutputIterator>::key (std::string const & k) {
                if (k == "compilation") {
                    seen_[compilation] = true;
                    return this->push<string_rule> (&compilation_);
                }
                if (k == "index") {
                    seen_[index] = true;
                    return this->push<uint64_rule> (&index_);
                }
                return error::unrecognized_section_object_key;
            }